

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<QObject*,QPointer<QHttp2Stream>>::emplace<QPointer<QHttp2Stream>const&>
          (QHash<QObject*,QPointer<QHttp2Stream>> *this,QObject **key,QPointer<QHttp2Stream> *args)

{
  Data<QHashPrivate::Node<QObject_*,_QPointer<QHttp2Stream>_>_> *pDVar1;
  long in_FS_OFFSET;
  piter pVar2;
  QPointer<QHttp2Stream> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data<QHashPrivate::Node<QObject_*,_QPointer<QHttp2Stream>_>_> **)this;
  if (pDVar1 == (Data<QHashPrivate::Node<QObject_*,_QPointer<QHttp2Stream>_>_> *)0x0) {
    local_30.wp.d = (Data *)0x0;
LAB_001fa244:
    pDVar1 = (Data<QHashPrivate::Node<QObject_*,_QPointer<QHttp2Stream>_>_> *)0x0;
LAB_001fa266:
    pDVar1 = QHashPrivate::Data<QHashPrivate::Node<QObject_*,_QPointer<QHttp2Stream>_>_>::detached
                       (pDVar1);
    *(Data<QHashPrivate::Node<QObject_*,_QPointer<QHttp2Stream>_>_> **)this = pDVar1;
LAB_001fa26e:
    pVar2 = (piter)emplace_helper<QPointer<QHttp2Stream>const&>(this,key,args);
    QHash<QObject_*,_QPointer<QHttp2Stream>_>::~QHash
              ((QHash<QObject_*,_QPointer<QHttp2Stream>_> *)&local_30);
  }
  else {
    if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      local_30.wp.d = (Data *)pDVar1;
      if ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
        LOCK();
        (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        pDVar1 = *(Data<QHashPrivate::Node<QObject_*,_QPointer<QHttp2Stream>_>_> **)this;
        if (pDVar1 == (Data<QHashPrivate::Node<QObject_*,_QPointer<QHttp2Stream>_>_> *)0x0)
        goto LAB_001fa244;
      }
      if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) goto LAB_001fa266;
      goto LAB_001fa26e;
    }
    if ((DestroyerFn)pDVar1->size < (DestroyerFn)(pDVar1->numBuckets >> 1)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        pVar2 = (piter)emplace_helper<QPointer<QHttp2Stream>const&>(this,key,args);
        return (iterator)pVar2;
      }
      goto LAB_001fa2fe;
    }
    local_30.wp.d = (args->wp).d;
    local_30.wp.value = (args->wp).value;
    if ((Data<QHashPrivate::Node<QObject_*,_QPointer<QHttp2Stream>_>_> *)local_30.wp.d !=
        (Data<QHashPrivate::Node<QObject_*,_QPointer<QHttp2Stream>_>_> *)0x0) {
      LOCK();
      (((Data<QHashPrivate::Node<QObject_*,_QPointer<QHttp2Stream>_>_> *)local_30.wp.d)->ref).atomic
      ._q_value.super___atomic_base<int>._M_i =
           (((Data<QHashPrivate::Node<QObject_*,_QPointer<QHttp2Stream>_>_> *)local_30.wp.d)->ref).
           atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pVar2 = (piter)emplace_helper<QPointer<QHttp2Stream>>(this,key,&local_30);
    if ((Data<QHashPrivate::Node<QObject_*,_QPointer<QHttp2Stream>_>_> *)local_30.wp.d !=
        (Data<QHashPrivate::Node<QObject_*,_QPointer<QHttp2Stream>_>_> *)0x0) {
      LOCK();
      ((local_30.wp.d)->weakref)._q_value.super___atomic_base<int>._M_i =
           ((local_30.wp.d)->weakref)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_30.wp.d)->weakref)._q_value.super___atomic_base<int>._M_i == 0) {
        pDVar1 = (Data<QHashPrivate::Node<QObject_*,_QPointer<QHttp2Stream>_>_> *)local_30.wp.d;
        if ((Data<QHashPrivate::Node<QObject_*,_QPointer<QHttp2Stream>_>_> *)local_30.wp.d ==
            (Data<QHashPrivate::Node<QObject_*,_QPointer<QHttp2Stream>_>_> *)0x0) {
          pDVar1 = (Data<QHashPrivate::Node<QObject_*,_QPointer<QHttp2Stream>_>_> *)0x0;
        }
        operator_delete(pDVar1);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar2;
  }
LAB_001fa2fe:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }